

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_size.c
# Opt level: O2

int pull_by_size(char *input_file,int min,int max,int length,int convert,int just_count)

{
  char *pcVar1;
  int iVar2;
  gzFile pgVar3;
  kseq_t *seq;
  kstream_t *pkVar4;
  uchar *puVar5;
  uint uVar6;
  char *__ptr;
  uint uVar7;
  
  pgVar3 = (gzFile)gzopen(input_file,"r");
  if (pgVar3 != (gzFile)0x0) {
    seq = (kseq_t *)calloc(1,0x70);
    pkVar4 = (kstream_t *)calloc(1,0x20);
    pkVar4->f = pgVar3;
    puVar5 = (uchar *)malloc(0xffff);
    pkVar4->buf = puVar5;
    seq->f = pkVar4;
    kseq_read(seq);
    pcVar1 = (seq->qual).s;
    gzrewind(pgVar3);
    pkVar4 = seq->f;
    pkVar4->begin = 0;
    pkVar4->end = 0;
    pkVar4->is_eof = 0;
    seq->last_char = 0;
    uVar6 = 0;
    if (verbose_flag != 0) {
      __ptr = "Input is FASTQ format\n";
      if (pcVar1 == (char *)0x0) {
        __ptr = "Input is FASTA format\n";
      }
      fwrite(__ptr,0x16,1,_stderr);
    }
    uVar7 = 0;
    while( true ) {
      iVar2 = kseq_read(seq);
      if (iVar2 < 0) break;
      iVar2 = size_filter(seq,(uint)(pcVar1 == (char *)0x0),min,max,length,convert,just_count);
      uVar6 = uVar6 + (iVar2 == 0);
      uVar7 = uVar7 + (iVar2 != 0);
    }
    if (seq != (kseq_t *)0x0) {
      free((seq->name).s);
      free((seq->comment).s);
      free((seq->seq).s);
      free((seq->qual).s);
      pkVar4 = seq->f;
      if (pkVar4 != (kstream_t *)0x0) {
        free(pkVar4->buf);
        free(pkVar4);
      }
      free(seq);
    }
    gzclose(pgVar3);
    if (just_count != 0) {
      fprintf(_stdout,"Total output: %i\n",(ulong)uVar7);
      fprintf(_stdout,"Total excluded: %i\n",(ulong)uVar6);
    }
    return uVar7;
  }
  fprintf(_stderr,"%s - Couldn\'t open fasta file %s\n",progname,input_file);
  exit(1);
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_size(char *input_file, int min, int max,int length, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int hit = 0;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

    if (verbose_flag) {
        if (is_fasta)
            fprintf(stderr, "Input is FASTA format\n");
        else
            fprintf(stderr, "Input is FASTQ format\n");
    }

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		hit = size_filter(seq, is_fasta, min, max, length, convert, just_count);
		if (hit)
			count++;
		else
			excluded++;
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}